

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadGeometryLibrary(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  Mesh *this_00;
  mapped_type *ppMVar4;
  undefined4 extraout_var_00;
  string id;
  allocator<char> local_51;
  key_type local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"geometry");
        if (bVar1) {
          uVar3 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar2),&local_51);
          this_00 = (Mesh *)operator_new(0x2a0);
          Collada::Mesh::Mesh(this_00);
          ppMVar4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
                    ::operator[](&this->mMeshLibrary,&local_50);
          *ppMVar4 = this_00;
          uVar3 = TestAttribute(this,"name");
          if (uVar3 != 0xffffffff) {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::assign((char *)this_00);
          }
          ReadGeometry(this,this_00);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"library_geometries");
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Expected end of <library_geometries> element.",&local_51);
      ThrowException(this,&local_50);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadGeometryLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("geometry"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int indexID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(indexID);

                // TODO: (thom) support SIDs
                // ai_assert( TestAttribute( "sid") == -1);

                // create a mesh and store it in the library under its ID
                Mesh* mesh = new Mesh;
                mMeshLibrary[id] = mesh;

                // read the mesh name if it exists
                const int nameIndex = TestAttribute("name");
                if (nameIndex != -1)
                {
                    mesh->mName = mReader->getAttributeValue(nameIndex);
                }

                // read on from there
                ReadGeometry(mesh);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_geometries") != 0)
                ThrowException("Expected end of <library_geometries> element.");

            break;
        }
    }
}